

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O2

Value * __thiscall
duckdb::Value::CreateValue<char_const*>(Value *__return_storage_ptr__,Value *this,char *value)

{
  allocator local_31;
  string local_30;
  
  ::std::__cxx11::string::string((string *)&local_30,(char *)this,&local_31);
  Value(__return_storage_ptr__,&local_30);
  ::std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

Value Value::CreateValue(const char *value) {
	return Value(string(value));
}